

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall fast_float::bigint::mul(bigint *this,limb y)

{
  bool bVar1;
  limb y_local;
  bigint *this_local;
  
  bVar1 = small_mul<(unsigned_short)62>(&this->vec,y);
  return bVar1;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool mul(limb y) noexcept {
    return small_mul(vec, y);
  }